

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O2

int Saig_ManCexVerifyUsingTernary(Aig_Man_t *pAig,Abc_Cex_t *pCex,Abc_Cex_t *pCare)

{
  uint uVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  
  if (pCex->iFrame != pCare->iFrame) {
    __assert_fail("pCex->iFrame == pCare->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x28b,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)")
    ;
  }
  if (pCex->nBits == pCare->nBits) {
    if (pAig->nTruePos <= pCex->iPo) {
      __assert_fail("pCex->iPo < Saig_ManPoNum(pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                    ,0x28d,
                    "int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
    }
    *(ulong *)&pAig->pConst1->field_0x18 =
         *(ulong *)&pAig->pConst1->field_0x18 & 0xffffffffffffffcf | 0x20;
    iVar7 = 0;
    while( true ) {
      if (pAig->nRegs <= iVar7) {
        uVar9 = pCex->nRegs;
        for (iVar7 = 0; iVar7 <= pCex->iFrame; iVar7 = iVar7 + 1) {
          for (iVar8 = 0; uVar1 = iVar8 + uVar9, iVar8 < pAig->nTruePis; iVar8 = iVar8 + 1) {
            pvVar2 = Vec_PtrEntry(pAig->vCis,iVar8);
            if (((uint)(&pCare[1].iPo)[(int)uVar1 >> 5] >> (uVar1 & 0x1f) & 1) == 0) {
              *(byte *)((long)pvVar2 + 0x18) = *(byte *)((long)pvVar2 + 0x18) | 0x30;
            }
            else {
              uVar5 = *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffcf;
              if (((&pCex[1].iPo)[(int)uVar1 >> 5] & 1 << ((byte)uVar1 & 0x1f)) == 0) {
                uVar5 = uVar5 | 0x10;
              }
              else {
                uVar5 = uVar5 | 0x20;
              }
              *(ulong *)((long)pvVar2 + 0x18) = uVar5;
            }
          }
          for (iVar8 = 0; iVar8 < pAig->vObjs->nSize; iVar8 = iVar8 + 1) {
            pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar8);
            if ((pAVar3 != (Aig_Obj_t *)0x0) &&
               (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
              Saig_ObjCexMinSim(pAVar3);
            }
          }
          for (iVar8 = 0; iVar8 < pAig->vCos->nSize; iVar8 = iVar8 + 1) {
            pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar8);
            Saig_ObjCexMinSim(pAVar3);
          }
          for (iVar8 = 0; iVar8 < pAig->nRegs; iVar8 = iVar8 + 1) {
            pAVar3 = Saig_ManLi(pAig,iVar8);
            pAVar4 = Saig_ManLo(pAig,iVar8);
            uVar6 = (ulong)((uint)*(undefined8 *)&pAVar3->field_0x18 & 0x10);
            uVar5 = *(ulong *)&pAVar4->field_0x18;
            *(ulong *)&pAVar4->field_0x18 = uVar5 & 0xffffffffffffffef | uVar6;
            *(ulong *)&pAVar4->field_0x18 =
                 uVar5 & 0xffffffffffffffcf | uVar6 |
                 (ulong)((uint)*(undefined8 *)&pAVar3->field_0x18 & 0x20);
          }
          uVar9 = uVar1;
        }
        if (uVar9 == pCex->nBits) {
          pAVar3 = Aig_ManCo(pAig,pCex->iPo);
          return (uint)((*(ulong *)&pAVar3->field_0x18 & 0x10) == 0) &
                 (uint)(*(ulong *)&pAVar3->field_0x18 >> 5) & 0x7ffffff;
        }
        __assert_fail("iBit == pCex->nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                      ,0x2bd,
                      "int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
      }
      pvVar2 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar7);
      if ((pCex[1].iPo & 1) != 0) {
        __assert_fail("!Abc_InfoHasBit(pCex->pData, iBit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                      ,0x292,
                      "int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
      }
      if ((pCare[1].iPo & 1) != 0) break;
      *(ulong *)((long)pvVar2 + 0x18) = *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffcf | 0x10;
      iVar7 = iVar7 + 1;
    }
    __assert_fail("!Abc_InfoHasBit(pCare->pData, iBit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x293,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)")
    ;
  }
  __assert_fail("pCex->nBits == pCare->nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                ,0x28c,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
}

Assistant:

int Saig_ManCexVerifyUsingTernary( Aig_Man_t * pAig, Abc_Cex_t * pCex, Abc_Cex_t * pCare )
{
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, f, iBit = 0;
    assert( pCex->iFrame == pCare->iFrame );
    assert( pCex->nBits  == pCare->nBits );
    assert( pCex->iPo < Saig_ManPoNum(pAig) );
    Saig_ObjCexMinSet1( Aig_ManConst1(pAig) );
    // set flops to the init state
    Saig_ManForEachLo( pAig, pObj, i )
    {
        assert( !Abc_InfoHasBit(pCex->pData, iBit) );
        assert( !Abc_InfoHasBit(pCare->pData, iBit) );
//        if ( Abc_InfoHasBit(pCare->pData, iBit++) )
            Saig_ObjCexMinSet0( pObj );
//        else
//            Saig_ObjCexMinSetX( pObj );
    }
    iBit = pCex->nRegs;
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // init inputs
        Saig_ManForEachPi( pAig, pObj, i )
        {
            if ( Abc_InfoHasBit(pCare->pData, iBit++) )
            {
                if ( Abc_InfoHasBit(pCex->pData, iBit-1) )
                    Saig_ObjCexMinSet1( pObj );
                else
                    Saig_ObjCexMinSet0( pObj );
            }
            else
                Saig_ObjCexMinSetX( pObj );
        }
        // simulate internal nodes
        Aig_ManForEachNode( pAig, pObj, i )
            Saig_ObjCexMinSim( pObj );
        // simulate COs
        Aig_ManForEachCo( pAig, pObj, i )
            Saig_ObjCexMinSim( pObj );
/*
        Aig_ManForEachObj( pAig, pObj, i )
        {
            Aig_ObjPrint(pAig, pObj);
            printf( "  Value = " );
            Saig_ObjCexMinPrint( pObj );
            printf( "\n" );
        }
*/
        // transfer
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, i )
            pObjRo->fMarkA = pObjRi->fMarkA,
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
    assert( iBit == pCex->nBits );
    return Saig_ObjCexMinGet1( Aig_ManCo( pAig, pCex->iPo ) );
}